

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_ssprk.c
# Opt level: O0

int compute_error(N_Vector y,sunrealtype t)

{
  double *pdVar1;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  sunrealtype err;
  sunrealtype ans;
  
  dVar2 = atan(in_XMM0_Qa);
  pdVar1 = (double *)N_VGetArrayPointer(in_RDI);
  fprintf(_stdout,"\nACCURACY at the final time = %g\n",ABS(*pdVar1 - dVar2));
  return 0;
}

Assistant:

static int compute_error(N_Vector y, sunrealtype t)
{
  sunrealtype ans, err; /* answer data, error */

  /* compute solution error */
  ans = ATAN(t);
  err = SUNRabs(N_VGetArrayPointer(y)[0] - ans);

  fprintf(stdout, "\nACCURACY at the final time = %" GSYM "\n", err);
  return 0;
}